

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O3

void __thiscall read_node_v8::operator()(read_node_v8 *this,ai_node *node,xr_reader *r)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  uint32_t u24;
  uint32_t local_1c;
  
  puVar5 = (r->field_2).m_p;
  lVar4 = 0;
  do {
    node->data[lVar4] = *puVar5;
    puVar2 = (r->field_2).m_p;
    puVar5 = puVar2 + 1;
    (r->field_2).m_p = puVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  (r->field_2).m_p = puVar2 + 3;
  uVar1 = *(uint16_t *)(puVar2 + 1);
  node->cover = uVar1;
  node->low_cover = uVar1;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  node->plane = *puVar3;
  local_1c = 0;
  xray_re::xr_reader::r_raw(r,&local_1c,3);
  node->packed_xz = local_1c;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  node->packed_y = *puVar3;
  return;
}

Assistant:

void operator()(ai_node& node, xr_reader& r) const {
	r.r_cseq(12, node.data);
	node.low_cover = node.cover = r.r_u16();
	node.plane = r.r_u16();
	node.packed_xz = r.r_u24();
	node.packed_y = r.r_u16();
}